

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint_t calcChecksum16(uint8_t *p0,size_t size)

{
  uint16_t uVar1;
  ulong in_RSI;
  uint16_t *in_RDI;
  uint_t checksum;
  void *end;
  uint16_t *p;
  uint_t local_24;
  uint16_t *local_18;
  
  local_24 = 0;
  for (local_18 = in_RDI; local_18 < (uint16_t *)((long)in_RDI + (in_RSI & 0xfffffffffffffffe));
      local_18 = local_18 + 1) {
    uVar1 = htons(*local_18);
    local_24 = uVar1 + local_24;
  }
  if ((in_RSI & 1) != 0) {
    local_24 = (uint)(byte)*local_18 * 0x100 + local_24;
  }
  return local_24;
}

Assistant:

uint_t calcChecksum16(
	const uint8_t* p0,
	size_t size
) {
	uint16_t const* p = (uint16_t const*)p0;
	void const* end = p0 + (size & ~1);

	uint_t checksum = 0;

	for (; p < end; p++)
		checksum += htons(*p);

	if (size & 1)
		checksum += *(uint8_t const*)p << 8;

	return checksum;
}